

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O2

Optimal * optimize(uchar *input_data,size_t input_size)

{
  ulong uVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *__ptr;
  Optimal *pOVar9;
  ulong uVar10;
  long lVar11;
  Optimal *pOVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  
  pvVar6 = calloc(0x881,8);
  pvVar7 = calloc(0x881,8);
  pvVar8 = calloc(0x10000,0x10);
  __ptr = calloc(input_size,0x10);
  pOVar9 = (Optimal *)calloc(input_size,0x10);
  auVar21._0_4_ = -(uint)((int)((ulong)pvVar6 >> 0x20) == 0 && (int)pvVar6 == 0);
  auVar21._4_4_ = -(uint)((int)pvVar7 == 0 && (int)((ulong)pvVar7 >> 0x20) == 0);
  auVar21._8_4_ = -(uint)((int)((ulong)pvVar8 >> 0x20) == 0 && (int)pvVar8 == 0);
  auVar21._12_4_ = -(uint)((int)__ptr == 0 && (int)((ulong)__ptr >> 0x20) == 0);
  iVar4 = movmskps((int)pOVar9,auVar21);
  if ((iVar4 != 0) || (pOVar9 == (Optimal *)0x0)) {
    fwrite("Error: Insufficient memory\n",0x1b,1,_stderr);
    exit(1);
  }
  pOVar9->bits = 8;
  sVar18 = 8;
  uVar20 = 1;
  do {
    if (input_size <= uVar20) {
      free(__ptr);
      return pOVar9;
    }
    sVar18 = sVar18 + 9;
    lVar11 = uVar20 * 0x10;
    pOVar9[uVar20].bits = sVar18;
    pOVar12 = pOVar9 + uVar20;
    puVar13 = (undefined8 *)
              ((ulong)(ushort)(*(ushort *)(input_data + (uVar20 - 1)) << 8 |
                              *(ushort *)(input_data + (uVar20 - 1)) >> 8) * 0x10 + (long)pvVar8);
    uVar1 = uVar20 + 1;
    uVar10 = 1;
    puVar14 = puVar13;
    uVar16 = sVar18;
    while( true ) {
      puVar2 = (undefined8 *)puVar14[1];
      if ((puVar2 == (undefined8 *)0x0) || (0xffff < uVar10)) goto LAB_0010578b;
      iVar4 = (int)uVar20 - (int)*puVar2;
      if (0x880 < iVar4) break;
      lVar19 = (long)iVar4;
      for (uVar17 = 2; uVar17 < 0x10001; uVar17 = uVar17 + 1) {
        if (uVar10 < uVar17) {
          sVar18 = pOVar9[uVar20 - uVar17].bits;
          iVar5 = count_bits(iVar4,(int)uVar17);
          uVar15 = (long)iVar5 + sVar18;
          uVar10 = uVar17;
          sVar18 = uVar16;
          if (uVar15 < uVar16) {
            pOVar12->bits = uVar15;
            pOVar12->offset = iVar4;
            pOVar12->len = (int)uVar17;
            uVar16 = uVar15;
            sVar18 = uVar15;
          }
        }
        else {
          lVar3 = *(long *)((long)pvVar7 + lVar19 * 8);
          if (((lVar3 != 0) && (uVar1 == lVar3 + uVar17)) &&
             (uVar17 = uVar20 - *(long *)((long)pvVar6 + lVar19 * 8), uVar10 <= uVar17)) {
            uVar17 = uVar10;
          }
        }
        if ((uVar20 < uVar17 + lVar19) ||
           (input_data[uVar20 - uVar17] != input_data[(uVar20 - uVar17) - lVar19])) break;
      }
      *(ulong *)((long)pvVar6 + lVar19 * 8) = uVar1 - uVar17;
      *(ulong *)((long)pvVar7 + lVar19 * 8) = uVar20;
      puVar14 = puVar2;
    }
    puVar14[1] = 0;
LAB_0010578b:
    *(ulong *)((long)__ptr + lVar11) = uVar20;
    *(undefined8 *)((long)__ptr + lVar11 + 8) = puVar13[1];
    puVar13[1] = (void *)((long)__ptr + lVar11);
    uVar20 = uVar1;
  } while( true );
}

Assistant:

Optimal* optimize(unsigned char *input_data, size_t input_size) {
    size_t *min;
    size_t *max;
    Match *matches;
    Match *match_slots;
    Optimal *optimal;
    Match *match;
    int match_index;
    int offset;
    size_t len;
    size_t best_len;
    size_t bits;
    size_t i;

    /* allocate all data structures at once */
    min = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    max = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    matches = (Match *)calloc(256*256, sizeof(Match));
    match_slots = (Match *)calloc(input_size, sizeof(Match));
    optimal = (Optimal *)calloc(input_size, sizeof(Optimal));

    if (!min || !max || !matches || !match_slots || !optimal) {
         fprintf(stderr, "Error: Insufficient memory\n");
         exit(1);
    }

    /* first byte is always literal */
    optimal[0].bits = 8;

    /* process remaining bytes */
    for (i = 1; i < input_size; i++) {

        optimal[i].bits = optimal[i-1].bits + 9;
        match_index = input_data[i-1] << 8 | input_data[i];
        best_len = 1;
        for (match = &matches[match_index]; match->next != NULL && best_len < ZX7_MAX_LEN; match = match->next) {
            offset = i - match->next->index;
            if (offset > ZX7_MAX_OFFSET) {
                match->next = NULL;
                break;
            }

            for (len = 2; len <= ZX7_MAX_LEN; len++) {
                if (len > best_len) {
                    best_len = len;
                    bits = optimal[i-len].bits + count_bits(offset, len);
                    if (optimal[i].bits > bits) {
                        optimal[i].bits = bits;
                        optimal[i].offset = offset;
                        optimal[i].len = len;
                    }
                } else if (i+1 == max[offset]+len && max[offset] != 0) {
                    len = i-min[offset];
                    if (len > best_len) {
                        len = best_len;
                    }
                }
                if (i < offset+len || input_data[i-len] != input_data[i-len-offset]) {
                    break;
                }
            }
            min[offset] = i+1-len;
            max[offset] = i;
        }
        match_slots[i].index = i;
        match_slots[i].next = matches[match_index].next;
        matches[match_index].next = &match_slots[i];
    }

    /* save time by releasing the largest block only, the O.S. will clean everything else later */
    free(match_slots);

    return optimal;
}